

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O1

RecyclableObject *
TTD::NSSnapObjects::DoObjectInflation_SnapMapInfo(SnapObject *snpObject,InflateMap *inflator)

{
  JavascriptLibrary *this;
  ScriptContext *pSVar1;
  RecyclableObject *pRVar2;
  
  pSVar1 = InflateMap::LookupScriptContext(inflator,snpObject->SnapType->ScriptContextLogId);
  this = (pSVar1->super_ScriptContextBase).javascriptLibrary;
  if (snpObject->SnapType->JsTypeId == TypeIds_Map) {
    pRVar2 = Js::JavascriptLibrary::CreateMap_TTD(this);
    return pRVar2;
  }
  pRVar2 = Js::JavascriptLibrary::CreateWeakMap_TTD(this);
  return pRVar2;
}

Assistant:

Js::RecyclableObject* DoObjectInflation_SnapMapInfo(const SnapObject* snpObject, InflateMap* inflator)
        {
            Js::ScriptContext* ctx = inflator->LookupScriptContext(snpObject->SnapType->ScriptContextLogId);

            if(snpObject->SnapType->JsTypeId == Js::TypeIds_Map)
            {
                return ctx->GetLibrary()->CreateMap_TTD();
            }
            else
            {
                return ctx->GetLibrary()->CreateWeakMap_TTD();
            }
        }